

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O1

void Gia_ManAutomWalkOne(Gia_Man_t *p,int nSteps,Vec_Wrd_t *vStates,Vec_Int_t *vCounts,
                        Vec_Wrd_t *vTemp,word Init)

{
  int iVar1;
  word wVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  word Cur;
  uint uVar9;
  int iVar10;
  word pNext [64];
  word local_238 [65];
  
  if (0 < nSteps) {
    Cur = 0;
    iVar4 = 0;
    do {
      wVar2 = Gia_ManAutomStep(p,Cur,local_238,vTemp);
      if (p->nRegs < p->vCis->nSize) {
        uVar9 = 0xffffffff;
        iVar10 = 1000000000;
        uVar5 = 0;
        uVar7 = 0xffffffff;
        do {
          if (local_238[uVar5] != Init) {
            uVar8 = 0xffffffff;
            if (0 < (long)vStates->nSize) {
              lVar3 = 0;
              do {
                if (vStates->pArray[lVar3] == local_238[uVar5]) {
                  uVar8 = (uint)lVar3;
                  break;
                }
                lVar3 = lVar3 + 1;
              } while (vStates->nSize != lVar3);
            }
            if (uVar8 == 0xffffffff) {
              iVar6 = 0;
            }
            else {
              if (((int)uVar8 < 0) || (vCounts->nSize <= (int)uVar8)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar6 = vCounts->pArray[uVar8];
            }
            if ((iVar6 < iVar10) ||
               ((iVar6 != 0 && iVar10 != 1000000000 &&
                (iVar1 = rand(), (float)iVar1 * 4.656613e-10 < (float)iVar10 / (float)iVar6)))) {
              uVar7 = uVar5 & 0xffffffff;
              iVar10 = iVar6;
              uVar9 = uVar8;
            }
            iVar6 = (int)uVar7;
            if (iVar10 == 0) {
              iVar10 = 0;
              break;
            }
          }
          iVar6 = (int)uVar7;
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)p->vCis->nSize - (long)p->nRegs);
      }
      else {
        iVar10 = 1000000000;
        iVar6 = -1;
        uVar9 = 0xffffffff;
      }
      if (iVar10 == 1000000000) {
        if (p->nRegs < p->vCis->nSize) {
          lVar3 = 0;
          do {
            if ((long)(wVar2 << ((byte)lVar3 & 0x3f)) < 0) {
              putchar((int)lVar3 + 0x61);
              putchar(0x21);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < (long)p->vCis->nSize - (long)p->nRegs);
        }
        break;
      }
      if (999999999 < iVar10) {
        __assert_fail("CountMin < ABC_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                      ,0x1c5,
                      "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                     );
      }
      if (uVar9 == 0xffffffff) {
        if (iVar10 != 0) {
          __assert_fail("CountMin == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                        ,0x1c8,
                        "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                       );
        }
        uVar9 = vCounts->nSize;
        Vec_IntPush(vCounts,0);
        Vec_WrdPush(vStates,local_238[iVar6]);
      }
      if (((int)uVar9 < 0) || (vCounts->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      vCounts->pArray[uVar9] = vCounts->pArray[uVar9] + 1;
      Cur = local_238[iVar6];
      putchar(iVar6 + 0x61);
      if ((wVar2 >> ((ulong)(byte)(0x3f - (char)iVar6) & 0x3f) & 1) != 0) {
        putchar(0x21);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != nSteps);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManAutomWalkOne( Gia_Man_t * p, int nSteps, Vec_Wrd_t * vStates, Vec_Int_t * vCounts, Vec_Wrd_t * vTemp, word Init )
{
    word iState = 0, Output, pNext[64]; 
    int i, k, kMin, Index, IndexMin;
    int Count, CountMin; 
    for ( i = 0; i < nSteps; i++ )
    {
        Output = Gia_ManAutomStep( p, iState, pNext, vTemp );
        // check visited states
        kMin = -1;
        IndexMin = -1;
        CountMin = ABC_INFINITY;  
        for ( k = 0; k < Gia_ManPiNum(p); k++ )
        {
            if ( pNext[k] == Init )
                continue;
            Index = Vec_WrdFind( vStates, pNext[k] );
            Count = Index == -1 ? 0 : Vec_IntEntry( vCounts, Index );
            if ( CountMin > Count || (CountMin != ABC_INFINITY && Count && ((float)CountMin / Count) > (float)rand()/RAND_MAX ) )
            {
                CountMin = Count;
                IndexMin = Index;
                kMin = k;
            }
            if ( CountMin == 0 )
                break;
        }
        // choose the best state
        if ( CountMin == ABC_INFINITY )
        {
            for ( k = 0; k < Gia_ManPiNum(p); k++ )
                if ( (Output >> (63-k)) & 1 )
                {
                    printf( "%c", 'a' + k );
                    printf( "!" );
                }            
            break;
        }
        assert( CountMin < ABC_INFINITY );
        if ( IndexMin == -1 )
        {
            assert( CountMin == 0 );
            IndexMin = Vec_IntSize(vCounts);
            Vec_IntPush( vCounts, 0 );
            Vec_WrdPush( vStates, pNext[kMin] );
        }
        Vec_IntAddToEntry( vCounts, IndexMin, 1 );
        iState = pNext[kMin];
//Extra_PrintBinary( stdout, (unsigned *)&iState, 64 ); printf( "\n" );
        // print the transition
        printf( "%c", 'a' + kMin );
        if ( (Output >> (63-kMin)) & 1 )
            printf( "!" );
    }
    printf( "\n" );
}